

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  add_thousands_sep<wchar_t> thousands_sep;
  basic_string_view<wchar_t> sep;
  wchar_t *pwVar1;
  undefined8 *in_RSI;
  wchar_t *in_RDI;
  basic_string_view<wchar_t> s;
  unsigned_long in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t wVar2;
  add_thousands_sep<wchar_t> local_38;
  basic_string_view<wchar_t> local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  basic_string_view<wchar_t>::basic_string_view(&local_20,in_RDI + 3,1);
  wVar2 = in_RDI[2];
  sep.size_ = local_20.size_;
  sep.data_ = local_20.data_;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_38,sep);
  thousands_sep.sep_.data_._4_4_ = wVar2;
  thousands_sep.sep_.data_._0_4_ = in_stack_ffffffffffffffb0;
  thousands_sep.sep_.size_ = (size_t)local_20.data_;
  thousands_sep._16_8_ = local_20.size_;
  pwVar1 = internal::
           format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (in_RDI,in_stack_ffffffffffffff90,local_38._20_4_,thousands_sep);
  *local_10 = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }